

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompPrimaryExpr(xmlXPathParserContextPtr ctxt)

{
  bool bVar1;
  xmlXPathParserContextPtr ctxt_local;
  
  while( true ) {
    bVar1 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
      bVar1 = *ctxt->cur == '\r';
    }
    if (!bVar1) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '$') {
    xmlXPathCompVariableReference(ctxt);
  }
  else if (*ctxt->cur == '(') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    xmlXPathCompileExpr(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
    if (*ctxt->cur != ')') {
      xmlXPathErr(ctxt,7);
      return;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
  }
  else if (((*ctxt->cur < 0x30) || (0x39 < *ctxt->cur)) &&
          ((*ctxt->cur != '.' || ((ctxt->cur[1] < 0x30 || (0x39 < ctxt->cur[1])))))) {
    if ((*ctxt->cur == '\'') || (*ctxt->cur == '\"')) {
      xmlXPathCompLiteral(ctxt);
    }
    else {
      xmlXPathCompFunctionCall(ctxt);
    }
  }
  else {
    xmlXPathCompNumber(ctxt);
  }
  while( true ) {
    bVar1 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
      bVar1 = *ctxt->cur == '\r';
    }
    if (!bVar1) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPrimaryExpr(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if (CUR == '$') xmlXPathCompVariableReference(ctxt);
    else if (CUR == '(') {
	NEXT;
	SKIP_BLANKS;
	xmlXPathCompileExpr(ctxt, 1);
	CHECK_ERROR;
	if (CUR != ')') {
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
	NEXT;
	SKIP_BLANKS;
    } else if (IS_ASCII_DIGIT(CUR) || (CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	xmlXPathCompNumber(ctxt);
    } else if ((CUR == '\'') || (CUR == '"')) {
	xmlXPathCompLiteral(ctxt);
    } else {
	xmlXPathCompFunctionCall(ctxt);
    }
    SKIP_BLANKS;
}